

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int element3(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  code *pcVar1;
  int iVar2;
  
  if (tok < 0x18) {
    if (tok == 0xf) {
      return 0;
    }
    if (tok == 0x15) {
      iVar2 = 0;
      pcVar1 = element4;
      goto LAB_0015eb6a;
    }
  }
  else {
    pcVar1 = declClose;
    if (tok == 0x18) {
      iVar2 = 0x28;
      goto LAB_0015eb6a;
    }
    if (tok == 0x24) {
      iVar2 = 0x29;
      goto LAB_0015eb6a;
    }
  }
  iVar2 = -1;
  pcVar1 = error;
  if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x34;
  }
LAB_0015eb6a:
  state->handler = pcVar1;
  return iVar2;
}

Assistant:

static
int element3(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_OR:
    state->handler = element4;
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}